

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week4-app2.cpp
# Opt level: O2

void __thiscall Vector<int>::operator=(Vector<int> *this,Vector<int> *other)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  
  iVar3 = this->N;
  piVar2 = this->values;
  if (iVar3 != other->N) {
    iVar3 = other->N;
    if (piVar2 != (int *)0x0) {
      operator_delete__(piVar2);
      iVar3 = other->N;
    }
    uVar5 = 0xffffffffffffffff;
    if (-1 < iVar3) {
      uVar5 = (long)iVar3 * 4;
    }
    piVar2 = (int *)operator_new__(uVar5);
    this->values = piVar2;
    this->N = iVar3;
  }
  piVar1 = other->values;
  for (lVar4 = 0; lVar4 < iVar3; lVar4 = lVar4 + 1) {
    piVar2[lVar4] = piVar1[lVar4];
    iVar3 = this->N;
  }
  return;
}

Assistant:

void operator=(const Vector& other)
    {
        if(N != other.N)
        {
            delete[](values);
            values = new T[other.N];
            N = other.N;
        }
        for(int i=0; i<N; ++i)
            values[i] = other.values[i];
    }